

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::LoadMetadata
          (duckdb *this,ClientContext *context,Allocator *allocator,CachingFileHandle *file_handle,
          shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
          EncryptionUtil *encryption_util,optional_idx footer_size)

{
  ThriftFileTransport *this_00;
  ulong file_size;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  long lVar7;
  pointer pTVar8;
  idx_t iVar9;
  uint64_t len;
  FileMetaData *this_01;
  FileCryptoMetaData *this_02;
  pointer pFVar10;
  type pFVar11;
  type iprot;
  ParquetEncryptionConfig *this_03;
  string *key;
  pointer pFVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *peVar14;
  undefined4 extraout_var;
  InvalidInputException *pIVar15;
  size_t __nbytes;
  _List_node_base *p_Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  ulong uVar18;
  __shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2> _Var19;
  bool footer_encrypted;
  uint32_t read_footer_len;
  ResizeableBuffer buf;
  optional_ptr<duckdb::ReadHead,_true> read_head;
  bool local_111;
  _Head_base<0UL,_duckdb_parquet::FileCryptoMetaData_*,_false> local_110;
  undefined1 local_108 [40];
  _Alloc_hider local_e0;
  _Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  string local_c0;
  EncryptionUtil *local_a0;
  duckdb *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_d0._8_8_ = encryption_config;
  local_a0 = encryption_util;
  local_98 = this;
  lVar7 = ::std::chrono::_V2::system_clock::now();
  __nbytes = 0x112e0be826d694b3;
  CreateThriftFileProtocol((duckdb *)&local_d8,file_handle,false);
  pTVar8 = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
           ::operator->((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_d8);
  this_00 = (ThriftFileTransport *)
            (pTVar8->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var13 = (pTVar8->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
  }
  file_size = this_00->size;
  if (file_size < 0xc) {
    pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_108._0_8_ = local_108 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"File \'%s\' too small to be a Parquet file","");
    CachingFileHandle::GetPath_abi_cxx11_(&local_50,file_handle);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar15,(string *)local_108,&local_50);
    __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (footer_size.index == 0xffffffffffffffff) {
    local_d0._M_allocated_capacity = (size_type)context;
    bVar5 = ShouldAndCanPrefetch(context,file_handle);
    len = 8;
    if (bVar5) {
      __nbytes = 0x20c49ba5e353f7cf;
      uVar18 = 0x4000;
      if (0x4000 < file_size / 1000) {
        uVar18 = file_size / 1000;
      }
      if (0x3ffff < uVar18) {
        uVar18 = 0x40000;
      }
      len = NextPowerOfTwo(uVar18);
      if (file_size <= len) {
        len = file_size;
      }
    }
    local_108._0_8_ = (data_ptr_t)0x0;
    local_108._8_8_ = 0;
    AllocatedData::AllocatedData((AllocatedData *)(local_108 + 0x10));
    local_e0._M_p = (pointer)0x0;
    ResizeableBuffer::resize((ResizeableBuffer *)local_108,allocator,8);
    switchD_010444a0::default((void *)local_108._0_8_,0,local_108._8_8_);
    ThriftFileTransport::Prefetch(this_00,file_size - len,len);
    this_00->location = file_size - 8;
    ThriftFileTransport::read(this_00,(int)local_108._0_8_,(void *)0x8,__nbytes);
    uVar2 = local_108._0_8_;
    CachingFileHandle::GetPath_abi_cxx11_(&local_c0,file_handle);
    ParseParquetFooter((data_ptr_t)uVar2,&local_c0,file_size,
                       (shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)local_d0._8_8_,
                       (uint32_t *)&local_110,&local_111);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    iVar9 = file_size - ((int)local_110._M_head_impl + 8);
    this_00->location = iVar9;
    if (len - 8 < ((ulong)local_110._M_head_impl & 0xffffffff)) {
      ThriftFileTransport::Prefetch(this_00,iVar9,(ulong)local_110._M_head_impl & 0xffffffff);
    }
    AllocatedData::~AllocatedData((AllocatedData *)(local_108 + 0x10));
    context = (ClientContext *)local_d0._M_allocated_capacity;
  }
  else {
    local_d0._M_allocated_capacity = (size_type)file_handle;
    iVar9 = optional_idx::GetIndex((optional_idx *)&read_footer_len);
    iVar6 = (int)iVar9;
    if ((iVar6 == 0) || (file_size < iVar6 + 0xc)) {
      pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Invalid footer length provided for file \'%s\'","");
      CachingFileHandle::GetPath_abi_cxx11_
                (&local_70,(CachingFileHandle *)local_d0._M_allocated_capacity);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar15,(string *)local_108,&local_70);
      __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar18 = file_size - (iVar6 + 8);
    this_00->location = uVar18;
    ThriftFileTransport::Prefetch(this_00,uVar18,(ulong)(iVar6 + 8));
    local_c0._M_dataplus._M_p = (pointer)0x0;
    for (p_Var16 = (this_00->ra_buffer).read_heads.
                   super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl.
                   _M_node.super__List_node_base._M_next;
        (ReadAheadBuffer *)p_Var16 != &this_00->ra_buffer; p_Var16 = p_Var16->_M_next) {
      if ((p_Var16[1]._M_next <= uVar18) &&
         (uVar18 < (ulong)((long)&(p_Var16[1]._M_prev)->_M_next + (long)p_Var16[1]._M_next))) {
        local_c0._M_dataplus._M_p = (pointer)(p_Var16 + 1);
        break;
      }
    }
    optional_ptr<duckdb::ReadHead,_true>::CheckValid
              ((optional_ptr<duckdb::ReadHead,_true> *)&local_c0);
    file_handle = (CachingFileHandle *)local_d0._M_allocated_capacity;
    p_Var16 = *(_List_node_base **)(local_c0._M_dataplus._M_p + 0x28);
    CachingFileHandle::GetPath_abi_cxx11_
              ((string *)local_108,(CachingFileHandle *)local_d0._M_allocated_capacity);
    ParseParquetFooter((data_ptr_t)((long)&p_Var16->_M_next + (iVar9 & 0xffffffff)),
                       (string *)local_108,file_size,
                       (shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)local_d0._8_8_,
                       (uint32_t *)&local_110,&local_111);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
    if ((int)local_110._M_head_impl != iVar6) {
      pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,
                 "Parquet footer length stored in file is not equal to footer length provided","");
      InvalidInputException::InvalidInputException(pIVar15,(string *)local_108);
      __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_01 = (FileMetaData *)operator_new(0x170);
  duckdb_parquet::FileMetaData::FileMetaData(this_01);
  local_c0._M_dataplus._M_p = (pointer)this_01;
  if (local_111 == true) {
    this_02 = (FileCryptoMetaData *)operator_new(0xe0);
    duckdb_parquet::FileCryptoMetaData::FileCryptoMetaData(this_02);
    local_110._M_head_impl = this_02;
    pFVar10 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                            *)&local_110);
    (**(code **)(*(long *)pFVar10 + 0x10))(pFVar10,local_d8._M_head_impl);
    pFVar10 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                            *)&local_110);
    if (((byte)(pFVar10->encryption_algorithm).__isset & 2) != 0) {
      pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,
                 "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",""
                );
      CachingFileHandle::GetPath_abi_cxx11_(&local_90,file_handle);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar15,(string *)local_108,&local_90);
      __cxa_throw(pIVar15,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pFVar11 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                           *)&local_c0);
    lVar1 = *(long *)(*(long *)pFVar11 + -0x30);
    iprot = unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
            ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                         *)&local_d8);
    this_03 = shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::operator->
                        ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)local_d0._8_8_);
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_03);
    ParquetCrypto::Read((TBase *)(&pFVar11->field_0x0 + lVar1),iprot,key,local_a0);
    if (local_110._M_head_impl != (FileCryptoMetaData *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  else {
    pFVar12 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              ::operator->((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                            *)&local_c0);
    (**(code **)(*(long *)pFVar12 + 0x10))(pFVar12,local_d8._M_head_impl);
  }
  pFVar11 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
            ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                         *)&local_c0);
  GeoParquetFileMetadata::TryRead((GeoParquetFileMetadata *)local_108,pFVar11,context);
  p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  _Var4._M_p = local_c0._M_dataplus._M_p;
  uVar2 = local_108._0_8_;
  p_Var13->_M_use_count = 1;
  p_Var13->_M_weak_count = 1;
  p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0247ba70;
  local_c0._M_dataplus._M_p = (pointer)0x0;
  local_108._0_8_ = (GeoParquetFileMetadata *)0x0;
  uVar3 = local_108._0_8_;
  p_Var13[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ParquetFileMetadataCache_0247bac0;
  *(pointer *)&p_Var13[1]._M_use_count = _Var4._M_p;
  p_Var13[2]._vptr__Sp_counted_base = (_func_int **)(lVar7 / 1000000000);
  local_108._0_4_ = (undefined4)uVar2;
  local_108._4_4_ = SUB84(uVar2,4);
  p_Var13[2]._M_use_count = local_108._0_4_;
  p_Var13[2]._M_weak_count = local_108._4_4_;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_98 = p_Var13 + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98 + 8) = p_Var13;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var13->_M_use_count = 2;
  }
  local_108._0_8_ = uVar3;
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
  peVar14 = extraout_RAX;
  _Var17._M_pi = extraout_RDX;
  if ((GeoParquetFileMetadata *)local_108._0_8_ != (GeoParquetFileMetadata *)0x0) {
    ::std::default_delete<duckdb::GeoParquetFileMetadata>::operator()
              ((default_delete<duckdb::GeoParquetFileMetadata> *)local_108,
               (GeoParquetFileMetadata *)local_108._0_8_);
    peVar14 = extraout_RAX_00;
    _Var17._M_pi = extraout_RDX_00;
  }
  _Var19._M_refcount._M_pi = _Var17._M_pi;
  _Var19._M_ptr = peVar14;
  if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
    _Var19 = (__shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>)
             (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
  }
  if (local_d8._M_head_impl != (TProtocol *)0x0) {
    iVar6 = (*(local_d8._M_head_impl)->_vptr_TProtocol[1])();
    _Var19._M_ptr._4_4_ = extraout_var;
    _Var19._M_ptr._0_4_ = iVar6;
    _Var19._M_refcount._M_pi = extraout_RDX_01._M_pi;
  }
  return (original)(original)_Var19;
}

Assistant:

static shared_ptr<ParquetFileMetadataCache>
LoadMetadata(ClientContext &context, Allocator &allocator, CachingFileHandle &file_handle,
             const shared_ptr<const ParquetEncryptionConfig> &encryption_config, const EncryptionUtil &encryption_util,
             optional_idx footer_size) {
	auto current_time = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

	auto file_proto = CreateThriftFileProtocol(file_handle, false);
	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto->getTransport());
	auto file_size = transport.GetSize();
	if (file_size < 12) {
		throw InvalidInputException("File '%s' too small to be a Parquet file", file_handle.GetPath());
	}

	bool footer_encrypted;
	// footer size is not provided - read it from the back
	if (!footer_size.IsValid()) {
		// We have to do two reads here:
		// 1. The 8 bytes from the back to check if it's a Parquet file and the footer size
		// 2. The footer (after getting the size)
		// For local reads this doesn't matter much, but for remote reads this means two round trips,
		// which is especially bad for small Parquet files where the read cost is mostly round trips.
		// So, we prefetch more, to hopefully save a round trip.
		static constexpr idx_t ESTIMATED_FOOTER_RATIO = 1000; // Estimate 1/1000th of the file to be footer
		static constexpr idx_t MIN_PREFETCH_SIZE = 16384;     // Prefetch at least this many bytes
		static constexpr idx_t MAX_PREFETCH_SIZE = 262144;    // Prefetch at most this many bytes
		idx_t prefetch_size = 8;
		if (ShouldAndCanPrefetch(context, file_handle)) {
			prefetch_size = ClampValue(file_size / ESTIMATED_FOOTER_RATIO, MIN_PREFETCH_SIZE, MAX_PREFETCH_SIZE);
			prefetch_size = MinValue(NextPowerOfTwo(prefetch_size), file_size);
		}

		ResizeableBuffer buf;
		buf.resize(allocator, 8);
		buf.zero();

		transport.Prefetch(file_size - prefetch_size, prefetch_size);
		transport.SetLocation(file_size - 8);
		transport.read(buf.ptr, 8);

		uint32_t footer_len;
		ParseParquetFooter(buf.ptr, file_handle.GetPath(), file_size, encryption_config, footer_len, footer_encrypted);

		auto metadata_pos = file_size - (footer_len + 8);
		transport.SetLocation(metadata_pos);
		if (footer_len > prefetch_size - 8) {
			transport.Prefetch(metadata_pos, footer_len);
		}
	} else {
		auto footer_len = UnsafeNumericCast<uint32_t>(footer_size.GetIndex());
		if (footer_len == 0 || file_size < 12 + footer_len) {
			throw InvalidInputException("Invalid footer length provided for file '%s'", file_handle.GetPath());
		}

		idx_t total_footer_len = footer_len + 8;
		auto metadata_pos = file_size - total_footer_len;
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, total_footer_len);

		auto read_head = transport.GetReadHead(metadata_pos);
		auto data_ptr = read_head->buffer_ptr;

		uint32_t read_footer_len;
		ParseParquetFooter(data_ptr + footer_len, file_handle.GetPath(), file_size, encryption_config, read_footer_len,
		                   footer_encrypted);
		if (read_footer_len != footer_len) {
			throw InvalidInputException("Parquet footer length stored in file is not equal to footer length provided");
		}
	}

	auto metadata = make_uniq<FileMetaData>();
	if (footer_encrypted) {
		auto crypto_metadata = make_uniq<FileCryptoMetaData>();
		crypto_metadata->read(file_proto.get());
		if (crypto_metadata->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            file_handle.GetPath());
		}
		ParquetCrypto::Read(*metadata, *file_proto, encryption_config->GetFooterKey(), encryption_util);
	} else {
		metadata->read(file_proto.get());
	}

	// Try to read the GeoParquet metadata (if present)
	auto geo_metadata = GeoParquetFileMetadata::TryRead(*metadata, context);

	return make_shared_ptr<ParquetFileMetadataCache>(std::move(metadata), current_time, std::move(geo_metadata));
}